

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

Matrix3d * Vector2Matrix(Vector3d *vec)

{
  double dVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  ActualDstType actualDst;
  Matrix3d *m;
  
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [6] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [7] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [4] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [5] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [2] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [3] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [0] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [1] = 0.0;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [8] = 0.0;
  dVar1 = (vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
          [0];
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [7] = -dVar1;
  uVar2 = *(undefined4 *)
           ((vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array + 1);
  uVar3 = *(uint *)((long)(vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array + 0xc);
  uVar4 = *(undefined4 *)
           ((vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
            array + 2);
  uVar5 = *(uint *)((long)(vec->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array + 0x14);
  *(undefined4 *)
   ((actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
   + 6) = uVar2;
  *(uint *)((long)(actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array + 0x34) = uVar3;
  *(undefined4 *)
   ((actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
   + 2) = uVar4;
  *(uint *)((long)(actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array + 0x14) = uVar5;
  *(undefined4 *)
   ((actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
   + 2) = uVar2;
  *(uint *)((long)(actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array + 0x14) = uVar3 ^ 0x80000000;
  *(undefined4 *)
   ((actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
   + 3) = uVar4;
  *(uint *)((long)(actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).
                  m_storage.m_data.array + 0x1c) = uVar5 ^ 0x80000000;
  (actualDst->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.m_data.array
  [5] = dVar1;
  return actualDst;
}

Assistant:

Matrix3d Vector2Matrix(Vector3d vec) {
    Matrix3d m = Matrix3d::Zero();
    m(0, 1) = -vec(2, 0);
    m(0, 2) = vec(1, 0);

    m(1, 0) = vec(2, 0);
    m(1, 2) = -vec(0, 0);

    m(2, 0) = -vec(1, 0);
    m(2, 1) = vec(0, 0);

    return m;
}